

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O1

void nn_hash_insert(nn_hash *self,uint32_t key,nn_hash_item *item)

{
  uint32_t uVar1;
  ulong uVar2;
  nn_list_item *it;
  uint uVar3;
  nn_list *self_00;
  
  uVar3 = (key >> 0x10 ^ key ^ 0x3d) * 9;
  uVar3 = (uVar3 >> 4 ^ uVar3) * 0x27d4eb2d;
  uVar2 = (ulong)(uVar3 >> 0xf ^ uVar3) % (ulong)self->slots;
  self_00 = self->array;
  it = self_00[uVar2].first;
  if (it != (nn_list_item *)0x0) {
    do {
      if (*(uint32_t *)&it[-1].prev == key) {
        nn_hash_insert_cold_1();
        goto LAB_00101699;
      }
      it = nn_list_next(self_00,it);
    } while (it != (nn_list_item *)0x0);
    self_00 = self->array;
  }
  item->key = key;
  nn_list_insert(self_00 + uVar2,&item->list,(nn_list_item *)0x0);
  uVar1 = self->items;
  self->items = uVar1 + 1;
  if ((int)self->slots < 0 || uVar1 * 2 + 2 <= self->slots) {
    return;
  }
LAB_00101699:
  nn_hash_rehash(self);
  return;
}

Assistant:

void nn_hash_insert (struct nn_hash *self, uint32_t key,
    struct nn_hash_item *item)
{
    struct nn_list_item *it;
    uint32_t i;

    i = nn_hash_key (key) % self->slots;

    for (it = nn_list_begin (&self->array [i]);
          it != nn_list_end (&self->array [i]);
          it = nn_list_next (&self->array [i], it))
        nn_assert (nn_cont (it, struct nn_hash_item, list)->key != key);

    item->key = key;
    nn_list_insert (&self->array [i], &item->list,
        nn_list_end (&self->array [i]));
    ++self->items;

    /*  If the hash is getting full, double the amount of slots and
        re-hash all the items. */
    if (nn_slow (self->items * 2 > self->slots && self->slots < 0x80000000))
    nn_hash_rehash(self);
}